

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O0

TermList * __thiscall
Lib::Map<Kernel::TermSpec,_Kernel::TermList,_Lib::DefaultHash>::insert
          (Map<Kernel::TermSpec,_Kernel::TermList,_Lib::DefaultHash> *this,TermSpec *key,
          TermList *val,uint code)

{
  bool bVar1;
  TermList *pTVar2;
  uint in_ECX;
  undefined8 *in_RSI;
  Map<Kernel::TermSpec,_Kernel::TermList,_Lib::DefaultHash> *in_RDI;
  Entry *entry;
  TermSpec *in_stack_ffffffffffffffa8;
  Entry *local_30;
  
  local_30 = firstEntryForCode(in_RDI,in_ECX);
  do {
    bVar1 = Entry::occupied(local_30);
    if (!bVar1) {
      in_RDI->_noOfEntries = in_RDI->_noOfEntries + 1;
      Entry::init(local_30,(EVP_PKEY_CTX *)*in_RSI);
      pTVar2 = Entry::value(local_30);
      return pTVar2;
    }
    if (local_30->code == in_ECX) {
      Entry::key(local_30);
      bVar1 = DefaultHash::equals<Kernel::TermSpec>((TermSpec *)in_RDI,in_stack_ffffffffffffffa8);
      if (bVar1) {
        pTVar2 = Entry::value(local_30);
        return pTVar2;
      }
    }
    local_30 = nextEntry(in_RDI,local_30);
  } while( true );
}

Assistant:

Val& insert(Key&& key, Val&& val,unsigned code)
  {
    Entry* entry;
    for (entry = firstEntryForCode(code); entry->occupied(); entry = nextEntry(entry)) {
      if (entry->code == code && Hash::equals(entry->key(),key)) {
        return entry->value();
      }
    }
    // entry is not occupied
    _noOfEntries++;
    entry->init(std::move(key), std::move(val), code);
    return entry->value();
  }